

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser.hpp
# Opt level: O0

vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
* __thiscall
bioparser::SamParser<bioparser::test::SamOverlap>::Parse
          (vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
           *__return_storage_ptr__,SamParser<bioparser::test::SamOverlap> *this,uint64_t bytes,
          bool shorten_names)

{
  uint32_t uVar1;
  vector<char,_std::allocator<char>_> *this_00;
  const_reference pvVar2;
  value_type c;
  uint local_150;
  bool local_149;
  uint32_t buffer_ptr;
  bool is_eof;
  anon_class_168_21_4e792969 create_T;
  uint32_t uStack_98;
  uint32_t quality_len;
  char *quality;
  uint32_t uStack_88;
  uint32_t data_len;
  char *data;
  uint32_t local_78;
  uint32_t template_len;
  uint32_t t_next_begin;
  uint32_t t_next_name_len;
  char *t_next_name;
  uint32_t uStack_60;
  uint32_t cigar_len;
  char *cigar;
  uint32_t local_50;
  uint32_t map_quality;
  uint32_t t_begin;
  uint32_t t_name_len;
  char *t_name;
  uint32_t flag;
  uint32_t q_name_len;
  char *q_name;
  uint64_t parsed_bytes;
  pointer puStack_20;
  bool shorten_names_local;
  uint64_t bytes_local;
  SamParser<bioparser::test::SamOverlap> *this_local;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  *dst;
  
  parsed_bytes._6_1_ = 0;
  parsed_bytes._7_1_ = shorten_names;
  puStack_20 = (pointer)bytes;
  bytes_local = (uint64_t)this;
  this_local = (SamParser<bioparser::test::SamOverlap> *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::vector(__return_storage_ptr__);
  q_name = (char *)0x0;
  _flag = (_func_int **)0x0;
  t_name._4_4_ = 0;
  t_name._0_4_ = 0;
  _t_begin = 0;
  map_quality = 0;
  local_50 = 0;
  cigar._4_4_ = 0;
  _uStack_60 = 0;
  t_next_name._4_4_ = 0;
  _t_next_begin = 0;
  template_len = 0;
  local_78 = 0;
  data._4_4_ = 0;
  _uStack_88 = 0;
  quality._4_4_ = 0;
  _uStack_98 = 0;
  create_T.parsed_bytes._4_4_ = 0;
  create_T.this = (SamParser<bioparser::test::SamOverlap> *)&flag;
  create_T.q_name = (char **)((long)&t_name + 4);
  create_T.q_name_len = (uint32_t *)&t_name;
  create_T.flag = &t_begin;
  create_T.t_name = (char **)&map_quality;
  create_T.t_name_len = &local_50;
  create_T.t_begin = (uint32_t *)((long)&cigar + 4);
  create_T.map_quality = &uStack_60;
  create_T.cigar = (char **)((long)&t_next_name + 4);
  create_T.cigar_len = &t_next_begin;
  create_T.t_next_name = (char **)&template_len;
  create_T.t_next_name_len = &local_78;
  create_T.t_next_begin = (uint32_t *)((long)&data + 4);
  create_T.template_len = &uStack_88;
  create_T.data = (char **)((long)&quality + 4);
  create_T.data_len = &uStack_98;
  create_T.quality = (char **)((long)&create_T.parsed_bytes + 4);
  create_T.quality_len = (uint32_t *)((long)&parsed_bytes + 7);
  create_T.dst = (vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                  *)&q_name;
  local_149 = false;
  _buffer_ptr = this;
  create_T.shorten_names = (bool *)__return_storage_ptr__;
  while( true ) {
    for (local_150 = Parser<bioparser::test::SamOverlap>::buffer_ptr
                               (&this->super_Parser<bioparser::test::SamOverlap>);
        uVar1 = Parser<bioparser::test::SamOverlap>::buffer_bytes
                          (&this->super_Parser<bioparser::test::SamOverlap>), local_150 < uVar1;
        local_150 = local_150 + 1) {
      this_00 = Parser<bioparser::test::SamOverlap>::buffer
                          (&this->super_Parser<bioparser::test::SamOverlap>);
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](this_00,(ulong)local_150);
      if (*pvVar2 == '\n') {
        uVar1 = Parser<bioparser::test::SamOverlap>::buffer_ptr
                          (&this->super_Parser<bioparser::test::SamOverlap>);
        Parser<bioparser::test::SamOverlap>::Store
                  (&this->super_Parser<bioparser::test::SamOverlap>,(ulong)(local_150 - uVar1),false
                  );
        Parse::anon_class_168_21_4e792969::operator()((anon_class_168_21_4e792969 *)&buffer_ptr);
        if (puStack_20 <= q_name) {
          return __return_storage_ptr__;
        }
      }
    }
    uVar1 = Parser<bioparser::test::SamOverlap>::buffer_ptr
                      (&this->super_Parser<bioparser::test::SamOverlap>);
    if (uVar1 < local_150) {
      uVar1 = Parser<bioparser::test::SamOverlap>::buffer_ptr
                        (&this->super_Parser<bioparser::test::SamOverlap>);
      Parser<bioparser::test::SamOverlap>::Store
                (&this->super_Parser<bioparser::test::SamOverlap>,(ulong)(local_150 - uVar1),false);
    }
    if (local_149 != false) break;
    local_149 = Parser<bioparser::test::SamOverlap>::Read
                          (&this->super_Parser<bioparser::test::SamOverlap>);
  }
  uVar1 = Parser<bioparser::test::SamOverlap>::storage_ptr
                    (&this->super_Parser<bioparser::test::SamOverlap>);
  if (uVar1 != 0) {
    Parse::anon_class_168_21_4e792969::operator()((anon_class_168_21_4e792969 *)&buffer_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;

    const char* q_name = nullptr;
    std::uint32_t q_name_len = 0;
    std::uint32_t flag = 0;
    const char* t_name = nullptr;
    std::uint32_t t_name_len = 0;
    std::uint32_t t_begin = 0;
    std::uint32_t map_quality = 0;
    const char* cigar = nullptr;
    std::uint32_t cigar_len = 0;
    const char* t_next_name = nullptr;
    std::uint32_t t_next_name_len = 0;
    std::uint32_t t_next_begin = 0;
    std::uint32_t template_len = 0;
    const char* data = nullptr;
    std::uint32_t data_len = 0;
    const char* quality = nullptr;
    std::uint32_t quality_len = 0;

    auto create_T = [&] () -> void {
      if (this->storage()[0] == '@') {  // file header
        this->Clear();
        return;
      }
      auto storage_ptr = this->RightStrip(
          this->storage().data(),
          this->storage_ptr());
      this->Terminate(storage_ptr);

      std::uint32_t num_values = 0;
      std::uint32_t begin_ptr = 0;
      while (true) {
        auto end_ptr = begin_ptr;
        while (end_ptr < storage_ptr && this->storage()[end_ptr] != '\t') {
          ++end_ptr;
        }
        this->Terminate(end_ptr);

        switch (num_values) {
          case 0:
            q_name = this->storage().data() + begin_ptr;
            q_name_len = end_ptr - begin_ptr;
            break;
          case 1: flag = std::atoi(this->storage().data() + begin_ptr); break;
          case 2:
            t_name = this->storage().data() + begin_ptr;
            t_name_len = end_ptr - begin_ptr;
            break;
          case 3: t_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 4: map_quality = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 5:
            cigar = this->storage().data() + begin_ptr;
            cigar_len = end_ptr - begin_ptr;
            break;
          case 6:
            t_next_name = this->storage().data() + begin_ptr;
            t_next_name_len = end_ptr - begin_ptr;
            break;
          case 7: t_next_begin = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 8: template_len = std::atoi(this->storage().data() + begin_ptr); break;  // NOLINT
          case 9:
            data = this->storage().data() + begin_ptr;
            data_len = end_ptr - begin_ptr;
            break;
          case 10:
            quality = this->storage().data() + begin_ptr;
            quality_len = end_ptr - begin_ptr;
            break;
          default: break;
        }

        ++num_values;
        if (end_ptr == storage_ptr || num_values == 11) {
          break;
        }
        begin_ptr = end_ptr + 1;
      }

      if (num_values != 11) {
        throw std::invalid_argument(
            "[bioparser::SamParser] error: invalid file format");
      }

      q_name_len = shorten_names ?
          this->Shorten(q_name, q_name_len) :
          this->RightStrip(q_name, q_name_len);

      t_name_len = shorten_names ?
          this->Shorten(t_name, t_name_len) :
          this->RightStrip(t_name, t_name_len);

      cigar_len = this->RightStrip(cigar, cigar_len);

      t_next_name_len = shorten_names ?
          this->Shorten(t_next_name, t_next_name_len) :
          this->RightStrip(t_next_name, t_next_name_len);

      data_len = this->RightStrip(data, data_len);
      quality_len = this->RightStrip(quality, quality_len);

      if (q_name_len == 0 || t_name_len == 0 || cigar_len == 0 ||
          t_next_name_len == 0 || data_len == 0 || quality_len == 0 ||
          (data_len > 1 && quality_len > 1 && data_len != quality_len)) {
        throw std::invalid_argument(
            "[bioparser::SamParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          q_name, q_name_len,
          flag,
          t_name, t_name_len, t_begin,
          map_quality,
          cigar, cigar_len,
          t_next_name, t_next_name_len, t_next_begin,
          template_len,
          data, data_len,
          quality, quality_len)));

      parsed_bytes += this->storage_ptr();
      this->Clear();
    };

    bool is_eof = false;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr());
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr());
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }